

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
try_handle_next_demand
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  pop_result_t pVar1;
  int iVar2;
  pointer ptVar3;
  undefined4 extraout_var;
  anon_class_16_2_3941ba46 local_a0;
  anon_class_8_1_8991fb9c_for_m_lambda local_90;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_mtsafe_st_env_infrastructure_cpp:761:7)>
  local_88;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_mtsafe_st_env_infrastructure_cpp:761:7)>
  work_tracking_stopper;
  duration<long,_std::ratio<60L,_1L>_> local_78;
  undefined8 local_70;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  duration sleep_time;
  undefined1 local_48 [4];
  pop_result_t pop_result;
  execution_demand_t demand;
  unique_lock<std::mutex> *acquired_lock_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  
  demand.m_demand_handler = (demand_handler_pfn_t)acquired_lock;
  execution_demand_t::execution_demand_t((execution_demand_t *)local_48);
  pVar1 = event_queue_impl_t::pop(&this->m_event_queue,(execution_demand_t *)local_48);
  if (pVar1 == empty_queue) {
    st_reusable_stuff::real_activity_tracker_t::wait_start_if_not_started(&this->m_activity_tracker)
    ;
    ptVar3 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
             operator->(&this->m_timer_manager);
    work_tracking_stopper.m_lambda.this._4_4_ = 1;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_78,
               (int *)((long)&work_tracking_stopper.m_lambda.this + 4));
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_70,&local_78);
    iVar2 = (*ptVar3->_vptr_timer_manager_t[3])(ptVar3,local_70);
    local_68.__r = CONCAT44(extraout_var,iVar2);
    (this->m_sync_objects).m_status = waiting;
    std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
              (&(this->m_sync_objects).m_wakeup_condition,
               (unique_lock<std::mutex> *)demand.m_demand_handler,&local_68);
    (this->m_sync_objects).m_status = working;
  }
  else {
    st_reusable_stuff::real_activity_tracker_t::wait_stopped(&this->m_activity_tracker);
    st_reusable_stuff::real_activity_tracker_t::work_started(&this->m_activity_tracker);
    local_90.this = this;
    details::
    at_scope_exit<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::try_handle_next_demand(std::unique_lock<std::mutex>&)::_lambda()_1_>
              ((details *)&local_88,&local_90);
    local_a0.demand = (execution_demand_t *)local_48;
    local_a0.this = this;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::try_handle_next_demand(std::unique_lock<std::mutex>&)::_lambda()_2_>
              ((unique_lock<std::mutex> *)demand.m_demand_handler,&local_a0);
    details::scope_exit_details::
    at_exit_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/simple_mtsafe_st_env_infrastructure.cpp:761:7)>
    ::~at_exit_t(&local_88);
  }
  execution_demand_t::~execution_demand_t((execution_demand_t *)local_48);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::try_handle_next_demand(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		execution_demand_t demand;
		const auto pop_result = m_event_queue.pop( demand );
		// If there is no demands we must go to sleep for some time...
		if( event_queue_impl_t::pop_result_t::empty_queue == pop_result )
			{
				// Tracking time for 'waiting' state must be turned on.
				m_activity_tracker.wait_start_if_not_started();

				const auto sleep_time =
						m_timer_manager->timeout_before_nearest_timer(
								std::chrono::minutes(1) );

				m_sync_objects.m_status = main_thread_status_t::waiting;

				m_sync_objects.m_wakeup_condition.wait_for(
						acquired_lock,
						sleep_time );

				m_sync_objects.m_status = main_thread_status_t::working;
			}
		else
			{
				// Tracking time for 'waiting' must be turned off, but
				// tracking time for 'working' must be tuned on and then off again.
				m_activity_tracker.wait_stopped();
				m_activity_tracker.work_started();
				auto work_tracking_stopper = so_5::details::at_scope_exit(
						[this]{ m_activity_tracker.work_stopped(); } );

				// There is at least one demand to process.
				helpers::unlock_do_and_lock_again( acquired_lock,
					[this, &demand] {
						m_default_disp.handle_demand( demand );
					} );
			}
	}